

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_input_type
          (CompilerMSL *this,uint32_t type_id,uint32_t location,uint32_t component,
          uint32_t num_components,bool strip_array)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  iterator iVar3;
  CompilerError *this_00;
  BaseType BVar4;
  uint components;
  key_type local_38;
  
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type_id);
  if (pSVar2->basetype == Struct) {
    return type_id;
  }
  if ((ulong)strip_array < (pSVar2->array).super_VectorView<unsigned_int>.buffer_size) {
    return type_id;
  }
  local_38.location = location;
  local_38.component = component;
  iVar3 = ::std::
          _Rb_tree<spirv_cross::LocationComponentPair,_std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>,_std::_Select1st<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
          ::find(&(this->inputs_by_location)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header) {
    if (num_components <= pSVar2->vecsize) {
      return type_id;
    }
  }
  else {
    if (num_components == 0) {
      num_components = *(uint32_t *)&iVar3._M_node[1]._M_right;
    }
    if (*(int *)&iVar3._M_node[1]._M_left == 2) {
      BVar4 = pSVar2->basetype;
      if (BVar4 != UInt) {
        if (BVar4 == Int) {
switchD_0022bee8_caseD_7:
          components = pSVar2->vecsize;
          if (pSVar2->vecsize < num_components) {
            components = num_components;
          }
          BVar4 = UInt;
          goto LAB_0022bf4c;
        }
        if (BVar4 != UShort) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,"Vertex attribute type mismatch between host and shader");
          goto LAB_0022bf90;
        }
      }
    }
    else if (*(int *)&iVar3._M_node[1]._M_left == 1) {
      switch(pSVar2->basetype) {
      case UByte:
      case UShort:
      case UInt:
        break;
      case Short:
        components = pSVar2->vecsize;
        if (pSVar2->vecsize < num_components) {
          components = num_components;
        }
        BVar4 = UShort;
        goto LAB_0022bf4c;
      case Int:
        goto switchD_0022bee8_caseD_7;
      default:
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Vertex attribute type mismatch between host and shader");
LAB_0022bf90:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (num_components <= pSVar2->vecsize) {
      return type_id;
    }
  }
  BVar4 = Unknown;
  components = num_components;
LAB_0022bf4c:
  uVar1 = build_extended_vector_type(this,type_id,components,BVar4);
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_input_type(uint32_t type_id, uint32_t location, uint32_t component, uint32_t num_components, bool strip_array)
{
	auto &type = get<SPIRType>(type_id);

	uint32_t max_array_dimensions = strip_array ? 1 : 0;

	// Struct and array types must match exactly.
	if (type.basetype == SPIRType::Struct || type.array.size() > max_array_dimensions)
		return type_id;

	auto p_va = inputs_by_location.find({location, component});
	if (p_va == end(inputs_by_location))
	{
		if (num_components > type.vecsize)
			return build_extended_vector_type(type_id, num_components);
		else
			return type_id;
	}

	if (num_components == 0)
		num_components = p_va->second.vecsize;

	switch (p_va->second.format)
	{
	case MSL_SHADER_VARIABLE_FORMAT_UINT8:
	{
		switch (type.basetype)
		{
		case SPIRType::UByte:
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Short:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UShort);
		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	case MSL_SHADER_VARIABLE_FORMAT_UINT16:
	{
		switch (type.basetype)
		{
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	default:
		if (num_components > type.vecsize)
			type_id = build_extended_vector_type(type_id, num_components);
		break;
	}

	return type_id;
}